

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

chunk_conflict * gauntlet_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  wchar_t wVar10;
  int iVar11;
  chunk *c;
  chunk *c_00;
  chunk *c_01;
  loc lVar12;
  loc lVar13;
  chunk *pcVar14;
  char *pcVar15;
  wchar_t wVar16;
  int iVar17;
  loc_conflict to_avoid;
  int iVar18;
  wchar_t wVar19;
  wchar_t h;
  wchar_t x0;
  loc_conflict lVar20;
  
  uVar6 = Rand_div(5);
  uVar7 = Rand_div(10);
  uVar1 = z_info->dungeon_hgt;
  uVar8 = Rand_div(uVar6 * -2 + 0x14);
  uVar2 = z_info->dungeon_wid;
  uVar9 = Rand_div(uVar7 * -2 + 0x18);
  if (dun->persist == true) {
    *p_error = "no gauntlet levels in persistent dungeons";
    return (chunk_conflict *)0x0;
  }
  c = (chunk *)labyrinth_chunk((int)p->depth,uVar6 * 2 + L'\x05',uVar7 * 2 + L'\x15',false,false);
  if (c == (chunk *)0x0) {
    pcVar15 = "labyrinth chunk could not be generated";
  }
  else {
    h = uVar1 - uVar8;
    iVar18 = (uint)uVar2 + uVar7 * -2;
    wVar16 = ((iVar18 - (iVar18 + -0x17 >> 0x1f)) + -0x17 >> 1) - uVar9;
    c_00 = (chunk *)cavern_chunk((int)p->depth,h,wVar16,(connector *)0x0);
    if (c_00 == (chunk *)0x0) {
      uncreate_artifacts((chunk_conflict *)c);
      cave_free((chunk_conflict *)c);
      pcVar15 = "left cavern chunk could not be generated";
    }
    else {
      iVar18 = 0;
      c_01 = (chunk *)cavern_chunk((int)p->depth,h,wVar16,(connector *)0x0);
      if (c_01 == (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c);
        cave_free((chunk_conflict *)c);
        uncreate_artifacts((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_00);
        pcVar15 = "right cavern chunk could not be generated";
      }
      else {
        wVar16 = c_00->width;
        x0 = c->width + wVar16;
        generate_mark(c_00,L'\0',L'\0',c_00->height + L'\xffffffff',wVar16 + L'\xffffffff',L'\x0f');
        generate_mark(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x10');
        generate_mark(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x0f');
        wVar10 = rand_range(2,3);
        alloc_stairs((chunk_conflict *)c_01,L'\x06',wVar10,L'\0',false,(connector *)0x0,dun->quest);
        wVar10 = rand_range(1,3);
        alloc_stairs((chunk_conflict *)c_00,L'\x05',wVar10,L'\0',false,(connector *)0x0,dun->quest);
        do {
          uVar6 = Rand_div(c->height + L'\xfffffffe');
          lVar12 = (loc)loc(0,uVar6 + 1);
          if (iVar18 < 0x14) {
            lVar20 = loc(1,0);
            lVar13 = (loc)loc_sum((loc_conflict)lVar12,lVar20);
            _Var4 = square_isperm((chunk_conflict *)c,lVar13);
            if (_Var4) {
              iVar18 = iVar18 + 1;
              iVar11 = 0;
            }
            else {
              square_set_feat((chunk_conflict *)c,lVar12,L'\x15');
              iVar11 = 3;
            }
          }
          else {
            uncreate_artifacts((chunk_conflict *)c);
            cave_free((chunk_conflict *)c);
            uncreate_artifacts((chunk_conflict *)c_00);
            cave_free((chunk_conflict *)c_00);
            uncreate_artifacts((chunk_conflict *)c_01);
            cave_free((chunk_conflict *)c_01);
            *p_error = "could not open entrance to the labyrinth";
            iVar11 = 1;
          }
        } while (iVar11 == 0);
        if (iVar11 != 3) {
          return (chunk_conflict *)0x0;
        }
        iVar18 = 0;
        do {
          wVar10 = c->width;
          uVar6 = Rand_div(c->height + L'\xfffffffe');
          lVar12 = (loc)loc(wVar10 + L'\xffffffff',uVar6 + 1);
          if (iVar18 < 0x14) {
            lVar20 = loc(-1,0);
            lVar13 = (loc)loc_sum((loc_conflict)lVar12,lVar20);
            _Var4 = square_isperm((chunk_conflict *)c,lVar13);
            if (_Var4) {
              iVar18 = iVar18 + 1;
              iVar11 = 0;
            }
            else {
              square_set_feat((chunk_conflict *)c,lVar12,L'\x15');
              iVar11 = 5;
            }
          }
          else {
            uncreate_artifacts((chunk_conflict *)c);
            cave_free((chunk_conflict *)c);
            uncreate_artifacts((chunk_conflict *)c_00);
            cave_free((chunk_conflict *)c_00);
            uncreate_artifacts((chunk_conflict *)c_01);
            cave_free((chunk_conflict *)c_01);
            *p_error = "could not open entrance to the labyrinth";
            iVar11 = 1;
          }
        } while (iVar11 == 0);
        if (iVar11 != 5) {
          return (chunk_conflict *)0x0;
        }
        uVar3._0_2_ = p->depth;
        uVar3._2_2_ = p->max_lev;
        if ((ushort)((undefined2)uVar3 - 0x21) < 0xffe5) {
          uVar6 = (uint)(5 < (short)(undefined2)uVar3) * 4 + 1;
        }
        else {
          uVar6 = (uVar3 & 0xffff) / 6;
        }
        pcVar14 = c_00;
        if (p->upkeep->create_down_stair != false) {
          pcVar14 = c_01;
        }
        _Var4 = new_player_spot((chunk_conflict *)pcVar14,p);
        if (_Var4) {
          iVar18 = (p->grid).x;
          iVar11 = (p->grid).y;
          wVar10 = x0;
          if (pcVar14 == c_01) {
            wVar10 = L'\0';
          }
          uVar1 = z_info->level_monster_min;
          uVar7 = Rand_div(4);
          if (0 < (int)((uint)uVar1 + uVar7 + uVar6 + 1)) {
            wVar19 = L'\0';
            if (pcVar14 == c_01) {
              wVar19 = x0;
            }
            lVar20.x = wVar19 + iVar18;
            lVar20.y = iVar11;
            iVar17 = (uint)uVar1 + uVar7 + uVar6 + 2;
            do {
              pick_and_place_distant_monster(c_00,lVar20,L'\0',true,c_00->depth);
              iVar17 = iVar17 + -1;
            } while (1 < iVar17);
          }
          uVar1 = z_info->level_monster_min;
          uVar7 = Rand_div(4);
          if (0 < (int)(uVar7 + uVar6 + (uint)uVar1 + 1)) {
            to_avoid.y = iVar11;
            to_avoid.x = iVar18 - wVar10;
            iVar18 = uVar7 + uVar6 + (uint)uVar1 + 2;
            do {
              pick_and_place_distant_monster(c_01,to_avoid,L'\0',true,c_01->depth);
              iVar18 = iVar18 + -1;
            } while (1 < iVar18);
          }
          uVar1 = z_info->level_monster_min;
          uVar7 = Rand_div(6);
          do {
            set_pit_type(c->depth,L'\0');
            _Var4 = mon_restrict(dun->pit_type->name,c->depth,c->depth,true);
          } while (!_Var4);
          if ((player->opts).opt[0x18] == true) {
            msg("Gauntlet - %s",dun->pit_type->name);
          }
          wVar10 = c->height / 2;
          wVar19 = c->width / 2;
          spread_monsters(c,dun->pit_type->name,c->depth,uVar6 + uVar7 + 1 + (uint)uVar1,wVar10,
                          wVar19,wVar10,wVar19,'\x06');
          mon_restrict((char *)0x0,c->depth,c->depth,false);
          pcVar14 = (chunk *)cave_new(h,c->width + c_00->width + c_01->width);
          pcVar14->depth = (int)p->depth;
          fill_rectangle(pcVar14,L'\0',L'\0',pcVar14->height + L'\xffffffff',
                         pcVar14->width + L'\xffffffff',L'\x15',L'\0');
          fill_rectangle(pcVar14,L'\0',wVar16,pcVar14->height + L'\xffffffff',x0 + L'\xffffffff',
                         L'\x16',L'\0');
          chunk_copy((chunk_conflict *)pcVar14,p,(chunk_conflict *)c_00,L'\0',L'\0',L'\0',false);
          chunk_copy((chunk_conflict *)pcVar14,p,(chunk_conflict *)c,(h - c->height) / 2,wVar16,
                     L'\0',false);
          chunk_copy((chunk_conflict *)pcVar14,p,(chunk_conflict *)c_01,L'\0',x0,L'\0',false);
          cave_free((chunk_conflict *)c_00);
          cave_free((chunk_conflict *)c);
          cave_free((chunk_conflict *)c_01);
          draw_rectangle(pcVar14,L'\0',L'\0',pcVar14->height + L'\xffffffff',
                         pcVar14->width + L'\xffffffff',L'\x16',L'\0',true);
          ensure_connectedness((chunk_conflict *)pcVar14,true);
          uVar7 = Rand_div(uVar6);
          alloc_objects((chunk_conflict *)pcVar14,L'\x01',L'\0',uVar7 + L'\x01',pcVar14->depth,'\0')
          ;
          uVar6 = Rand_div(uVar6);
          alloc_objects((chunk_conflict *)pcVar14,L'\x01',L'\x01',uVar6 + L'\x01',pcVar14->depth,
                        '\0');
          iVar5 = Rand_normal((uint)z_info->room_item_av,3);
          alloc_objects((chunk_conflict *)pcVar14,L'\x02',L'\x03',(int)iVar5,pcVar14->depth,'\x01');
          iVar5 = Rand_normal((uint)z_info->both_item_av,3);
          alloc_objects((chunk_conflict *)pcVar14,L'\x03',L'\x03',(int)iVar5,pcVar14->depth,'\x01');
          iVar5 = Rand_normal((uint)z_info->both_gold_av,3);
          alloc_objects((chunk_conflict *)pcVar14,L'\x03',L'\x02',(int)iVar5,pcVar14->depth,'\x01');
          return (chunk_conflict *)pcVar14;
        }
        uncreate_artifacts((chunk_conflict *)c);
        cave_free((chunk_conflict *)c);
        uncreate_artifacts((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_00);
        uncreate_artifacts((chunk_conflict *)c_01);
        cave_free((chunk_conflict *)c_01);
        pcVar15 = "could not place player";
      }
    }
  }
  *p_error = pcVar15;
  return (chunk_conflict *)0x0;
}

Assistant:

struct chunk *gauntlet_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	struct chunk *c;
	struct chunk *left;
	struct chunk *gauntlet;
	struct chunk *right;
	struct chunk *arrival;
	int gauntlet_hgt = 2 * randint1(5) + 3;
	int gauntlet_wid = 2 * randint1(10) + 19;
	int y_size = z_info->dungeon_hgt - randint0(25 - gauntlet_hgt);
	/*
	 * labyrinth_gen() generates something that's two grids wider than
	 * the argument passed, thus the extra "- 2" below.
	 */
	int x_size = (z_info->dungeon_wid - gauntlet_wid - 2) / 2 -
		randint0(45 - gauntlet_wid);
	struct loc p_loc_in_r, p_loc_in_l;
	int line1, line2;

	/* No persistent levels of this type for now */
	if (dun->persist) {
		*p_error = "no gauntlet levels in persistent dungeons";
		return NULL;
	}

	gauntlet = labyrinth_chunk(p->depth, gauntlet_hgt, gauntlet_wid, false,
		false);
	if (!gauntlet) {
		*p_error = "labyrinth chunk could not be generated";
		return NULL;
	}

	left = cavern_chunk(p->depth, y_size, x_size, NULL);
	if (!left) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		*p_error = "left cavern chunk could not be generated";
		return NULL;
	}

	right = cavern_chunk(p->depth, y_size, x_size, NULL);
	if (!right) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		*p_error = "right cavern chunk could not be generated";
		return NULL;
	}

	/* Record lines between chunks */
	line1 = left->width;
	line2 = line1 + gauntlet->width;

	/* Set the movement and mapping restrictions */
	generate_mark(left, 0, 0, left->height - 1, left->width - 1,
		SQUARE_NO_TELEPORT);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_MAP);
	generate_mark(gauntlet, 0, 0, gauntlet->height - 1, gauntlet->width - 1,
		SQUARE_NO_TELEPORT);

	/* Place down stairs in the right cavern */
	alloc_stairs(right, FEAT_MORE, rand_range(2, 3), 0, false, NULL,
		dun->quest);

	/* Place up stairs in the left cavern */
	alloc_stairs(left, FEAT_LESS, rand_range(1, 3), 0, false, NULL,
		dun->quest);

	/*
	 * Open the ends of the gauntlet.  Make sure the opening is
	 * horizontally adjacent to a non-permanent wall for interoperability
	 * with ensure_connectedness().
	 */
	i = 0;
	while (1) {
		struct loc grid = loc(0, randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}
	i = 0;
	while (1) {
		struct loc grid = loc(gauntlet->width - 1,
			randint1(gauntlet->height - 2));

		if (i >= 20) {
			uncreate_artifacts(gauntlet);
			cave_free(gauntlet);
			uncreate_artifacts(left);
			cave_free(left);
			uncreate_artifacts(right);
			cave_free(right);
			*p_error = "could not open entrance to the labyrinth";
			return NULL;
		}
		if (!square_isperm(gauntlet, loc_sum(grid, loc(-1, 0)))) {
			square_set_feat(gauntlet, grid, FEAT_GRANITE);
			break;
		}
		++i;
	}

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(p->depth / 3, 10), 2) / 2;

	/* Put the character in the arrival cavern */
	arrival = (p->upkeep->create_down_stair) ? right : left;
	if (!new_player_spot(arrival, p)) {
		uncreate_artifacts(gauntlet);
		cave_free(gauntlet);
		uncreate_artifacts(left);
		cave_free(left);
		uncreate_artifacts(right);
		cave_free(right);
		*p_error = "could not place player";
		return NULL;
	}
	/*
	 * Account for the player's location relative to the right and left
	 * chunks for use in pick_and_place_distant_monster().  The
	 * transformations here have to match what the calls to chunk_copy()
	 * below do.
	 */
	if (arrival == right) {
		p_loc_in_r = p->grid;
		p_loc_in_l.x = line2 + p->grid.x;
		p_loc_in_l.y = p->grid.y;
	} else {
		p_loc_in_l = p->grid;
		p_loc_in_r.x = p->grid.x - line2;
		p_loc_in_r.y = p->grid.y;
	}

	/* Pick some monsters for the left cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(left, p_loc_in_l, 0, true,
			left->depth);
	}

	/* Pick some of monsters for the right cavern */
	i = z_info->level_monster_min + randint1(4) + k;

	/* Place the monsters */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(right, p_loc_in_r, 0, true,
			right->depth);
	}

	/* Pick a larger number of monsters for the gauntlet */
	i = (z_info->level_monster_min + randint1(6) + k);

	/* Find appropriate monsters */
	while (true) {
		/* Choose a pit profile */
		set_pit_type(gauntlet->depth, 0);

		/* Set monster generation restrictions */
		if (mon_restrict(dun->pit_type->name, gauntlet->depth, gauntlet->depth, true))
			break;
	}

	ROOM_LOG("Gauntlet - %s", dun->pit_type->name);

	/* Place labyrinth monsters */
	spread_monsters(gauntlet, dun->pit_type->name, gauntlet->depth, i,
					gauntlet->height / 2, gauntlet->width / 2,
					gauntlet->height / 2, gauntlet->width / 2,
					ORIGIN_LABYRINTH);

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, gauntlet->depth, gauntlet->depth, false);

	/* Make the level */
	c = cave_new(y_size, left->width + gauntlet->width + right->width);
	c->depth = p->depth;

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_GRANITE, SQUARE_NONE);

	/* Fill the area between the caverns with permanent rock */
	fill_rectangle(c, 0, line1, c->height - 1, line2 - 1, FEAT_PERM,
		SQUARE_NONE);

	/* Copy in the pieces */
	chunk_copy(c, p, left, 0, 0, 0, false);
	chunk_copy(c, p, gauntlet, (y_size - gauntlet->height) / 2, line1, 0, false);
	chunk_copy(c, p, right, 0, line2, 0, false);

	/* Free the chunks */
	cave_free(left);
	cave_free(gauntlet);
	cave_free(right);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect */
	ensure_connectedness(c, true);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k), c->depth, 0);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}